

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.c
# Opt level: O2

int cLUWorkInit(int m,int n,int panel_size,int **iworkptr,singlecomplex **dworkptr,GlobalLU_t *Glu)

{
  int_t *piVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  singlecomplex *psVar5;
  singlecomplex *psVar6;
  int bytes;
  
  iVar2 = sp_ienv(3);
  iVar3 = sp_ienv(7);
  iVar2 = sp_ienv((uint)(iVar2 <= iVar3) * 4 + 3);
  iVar3 = sp_ienv(4);
  bytes = (panel_size * 2 + 5) * m * 4;
  iVar2 = (iVar3 + iVar2) * panel_size;
  if (iVar2 <= m) {
    iVar2 = m;
  }
  if (Glu->MemModel == SYSTEM) {
    piVar4 = int32Calloc(bytes >> 2);
  }
  else {
    piVar4 = (int *)cuser_malloc(bytes,1,Glu);
  }
  *iworkptr = piVar4;
  if (piVar4 == (int *)0x0) {
    fwrite("cLUWorkInit: malloc fails for local iworkptr[]\n",0x2f,1,_stderr);
    iVar2 = bytes + n;
  }
  else {
    iVar3 = (iVar2 + panel_size * m) * 8;
    if (Glu->MemModel == SYSTEM) {
      psVar5 = (singlecomplex *)superlu_malloc((long)iVar3);
      *dworkptr = psVar5;
    }
    else {
      psVar5 = (singlecomplex *)cuser_malloc(iVar3,1,Glu);
      *dworkptr = psVar5;
      if (((ulong)psVar5 & 7) != 0) {
        psVar6 = (singlecomplex *)(((ulong)((long)&psVar5->i + 3U) & 0xfffffffffffffff8) - 8);
        *dworkptr = psVar6;
        iVar2 = (int)psVar5 - (int)psVar6;
        piVar1 = &(Glu->stack).top2;
        *piVar1 = *piVar1 - iVar2;
        piVar1 = &(Glu->stack).used;
        *piVar1 = *piVar1 + iVar2;
        return 0;
      }
    }
    iVar2 = 0;
    if (psVar5 == (singlecomplex *)0x0) {
      fwrite("malloc fails for local dworkptr[].",0x22,1,_stderr);
      iVar2 = bytes + n + iVar3;
    }
  }
  return iVar2;
}

Assistant:

int
cLUWorkInit(int m, int n, int panel_size, int **iworkptr, 
            singlecomplex **dworkptr, GlobalLU_t *Glu)
{
    int    isize, dsize, extra;
    singlecomplex *old_ptr;
    int    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) ),
           rowblk   = sp_ienv(4);

    /* xplore[m] and xprune[n] can be 64-bit; they are allocated separately */
    //isize = ( (2 * panel_size + 3 + NO_MARKER ) * m + n ) * sizeof(int);
    isize = ( (2 * panel_size + 2 + NO_MARKER ) * m ) * sizeof(int);
    dsize = (m * panel_size +
	     NUM_TEMPV(m,panel_size,maxsuper,rowblk)) * sizeof(singlecomplex);
    
    if ( Glu->MemModel == SYSTEM ) 
	*iworkptr = (int *) int32Calloc(isize/sizeof(int));
    else
	*iworkptr = (int *) cuser_malloc(isize, TAIL, Glu);
    if ( ! *iworkptr ) {
	fprintf(stderr, "cLUWorkInit: malloc fails for local iworkptr[]\n");
	return (isize + n);
    }

    if ( Glu->MemModel == SYSTEM )
	*dworkptr = (singlecomplex *) SUPERLU_MALLOC(dsize);
    else {
	*dworkptr = (singlecomplex *) cuser_malloc(dsize, TAIL, Glu);
	if ( NotDoubleAlign(*dworkptr) ) {
	    old_ptr = *dworkptr;
	    *dworkptr = (singlecomplex*) DoubleAlign(*dworkptr);
	    *dworkptr = (singlecomplex*) ((double*)*dworkptr - 1);
	    extra = (char*)old_ptr - (char*)*dworkptr;
#if ( DEBUGlevel>=1 )
	    printf("cLUWorkInit: not aligned, extra %d\n", extra); fflush(stdout);
#endif	    
	    Glu->stack.top2 -= extra;
	    Glu->stack.used += extra;
	}
    }
    if ( ! *dworkptr ) {
	fprintf(stderr, "malloc fails for local dworkptr[].");
	return (isize + dsize + n);
    }
	
    return 0;
}